

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example2_SubSystem_SubSystemB_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if ((uVar1 & 0xffffffffffffff00) == 0x537472616e676500) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 1;
    *value_sign = 0;
  }
  else {
    if ((uVar1 & 0xffffffff00000000) != 0x4e4f4e4500000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example2_SubSystem_SubSystemB_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if ((w & 0xffffffffffffff00) == 0x537472616e676500) { /* "Strange" */
        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
        if (buf != mark) {
            *value = UINT64_C(1), *value_sign = 0;
        } else {
            return unmatched;
        }
    } else { /* "Strange" */
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "NONE" */
            return unmatched;
        } /* "NONE" */
    } /* "Strange" */
    return buf;
}